

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O1

int cymric_seed(cymric_rng *R,void *seed,int bytes)

{
  bool bVar1;
  long *plVar2;
  int iVar3;
  uint uVar4;
  __pid_t _Var5;
  int iVar6;
  int iVar7;
  long lVar8;
  time_t tVar9;
  size_t i;
  uint uVar10;
  timezone cateq_z;
  timeval cateq_v;
  blake2b_state state;
  uint8_t scratch_buff [48];
  long *local_260;
  timezone local_258;
  timeval local_250;
  blake2b_state local_240;
  long local_a0 [14];
  
  local_260 = local_a0;
  if (R == (cymric_rng *)0x0) {
    return -1;
  }
  if (!m_is_initialized) {
    return -2;
  }
  iVar3 = blake2b_init_key(&local_240,'@',R,'@');
  if (iVar3 != 0) {
    return -3;
  }
  if ((0 < bytes && seed != (void *)0x0) &&
     (iVar3 = blake2b_update(&local_240,(uint8_t *)seed,(ulong)(uint)bytes), iVar3 != 0)) {
    return -4;
  }
  plVar2 = local_260;
  gettimeofday(&local_250,&local_258);
  *(__pid_t *)plVar2 = (__pid_t)local_250.tv_usec;
  iVar3 = blake2b_update(&local_240,(uint8_t *)local_260,4);
  if (iVar3 != 0) {
    return -5;
  }
  uVar10 = (uint)(iVar3 == 0) << 5;
  uVar4 = read_file("/dev/random",(uint8_t *)local_260,0x14);
  iVar3 = read_file("/dev/urandom",(uint8_t *)((ulong)uVar4 + (long)local_260),0x20 - uVar4);
  if (iVar3 < (int)(0x20 - uVar4)) {
    iVar3 = -6;
  }
  else {
    iVar3 = blake2b_update(&local_240,(uint8_t *)local_260,0x20);
    if (iVar3 == 0) {
      uVar10 = uVar10 | 0x100;
      iVar3 = -5;
      bVar1 = true;
      goto LAB_001715e9;
    }
    iVar3 = -7;
  }
  bVar1 = false;
LAB_001715e9:
  plVar2 = local_260;
  if (bVar1) {
    _Var5 = getpid();
    *(__pid_t *)plVar2 = _Var5;
    iVar3 = blake2b_update(&local_240,(uint8_t *)local_260,4);
    plVar2 = local_260;
    if (iVar3 == 0) {
      lVar8 = syscall(0xba);
      *(__pid_t *)plVar2 = (__pid_t)lVar8;
      iVar6 = blake2b_update(&local_240,(uint8_t *)local_260,4);
      plVar2 = local_260;
      iVar3 = -0xf;
      if (iVar6 == 0) {
        gettimeofday(&local_250,&local_258);
        *plVar2 = local_250.tv_sec * 1000000 +
                  CONCAT44(local_250.tv_usec._4_4_,(__pid_t)local_250.tv_usec);
        iVar3 = blake2b_update(&local_240,(uint8_t *)local_260,8);
        if (iVar3 == 0) {
          uVar4 = rand();
          tVar9 = time((time_t *)0x0);
          srand(uVar4 ^ (uint)tVar9);
          plVar2 = local_260;
          iVar3 = rand();
          *(int *)plVar2 = iVar3;
          iVar3 = rand();
          *(int *)((long)plVar2 + 4) = iVar3;
          iVar3 = blake2b_update(&local_240,(uint8_t *)local_260,8);
          plVar2 = local_260;
          if (iVar3 == 0) {
            gettimeofday(&local_250,&local_258);
            *(__pid_t *)plVar2 = (__pid_t)local_250.tv_usec;
            iVar3 = blake2b_update(&local_240,(uint8_t *)local_260,4);
            if (iVar3 == 0) {
              LOCK();
              UNLOCK();
              *(int *)local_260 = (int)m_counter.super___atomic_base<unsigned_int>._M_i + 1;
              m_counter.super___atomic_base<unsigned_int>._M_i =
                   (__atomic_base<unsigned_int>)
                   (__atomic_base<unsigned_int>)
                   (m_counter.super___atomic_base<unsigned_int>._M_i + 1)._M_i;
              iVar6 = blake2b_update(&local_240,(uint8_t *)local_260,4);
              if (iVar6 == 0) {
                iVar7 = blake2b_final(&local_240,(uint8_t *)R,'@');
                iVar3 = -0x17;
                if (iVar7 == 0) {
                  lVar8 = 0;
                  do {
                    local_240.buf[lVar8] = '\0';
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 0x100);
                  lVar8 = 0;
                  do {
                    *(undefined1 *)((long)&local_260 + lVar8) = 0;
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 8);
                  iVar3 = -0x18;
                  if (0x1a8 < (iVar6 == 0) + 0x91 + uVar10) {
                    builtin_strncpy(R->internal + 0x40,"SEED",4);
                    iVar3 = 0;
                  }
                }
              }
              else {
                iVar3 = -0x16;
              }
            }
            else {
              iVar3 = -0x15;
            }
          }
          else {
            iVar3 = -0x14;
          }
        }
        else {
          iVar3 = -0x12;
        }
      }
    }
    else {
      iVar3 = -0xe;
    }
  }
  return iVar3;
}

Assistant:

int cymric_seed(
    cymric_rng* R,      ///< [out] Generator to seed
    const void* seed,   ///< [in] Seed bytes to use
    int bytes           ///< [in] Number of seed bytes
) {
    // Self-test, verified to fail if set too high
    static const int MIN_ENTROPY = 425;
    int entropy = 0;

    // Align scratch space to 16 bytes
    static const unsigned kAlignmentBytes = 16;

    // Scratch space for loading entropy source bits
    uint8_t scratch_buff[kAlignmentBytes + SEED_SCRATCH_BYTES];

    // Align scratch to avoid alignment issues on mobile
    uint8_t* scratch = scratch_buff;
    scratch += kAlignmentBytes - ((uintptr_t)scratch % kAlignmentBytes);

    // Initialize BLAKE2 state for 512-bit output
    blake2b_state state;

    // If input is invalid:
    if (!R)
        return -1;

    // If not initialized yet:
    if (!m_is_initialized)
        return -2;

    // Mix in previous or uninitialized state
    if (blake2b_init_key(&state, 64, R->internal, 64))
        return -3;

    // Mix in the seed
    if (seed && bytes > 0) {
        if (blake2b_update(&state, (const uint8_t *)seed, bytes))
            return -4;
    }

#ifdef CYMRIC_CYCLES
    {
        // Mix in initial cycle count
        uint32_t *t0 = (uint32_t *)scratch;
        *t0 = GetCPUCycles();
        if (blake2b_update(&state, scratch, 4))
            return -5;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_DEV_RANDOM
    {
        // Mix in /dev/random.
        // This is a bit of a hack.  Most Linuxy systems "cache" about 20 bytes
        // for /dev/random.  Requesting 32 bytes may take up to a minute longer
        // and this would be really irritating for users of the library.  So
        // instead we grab just 20 bytes and then take the rest from urandom,
        // which is often implemented as a separate pool that will actually
        // provide additional entropy over /dev/random even when that device
        // is blocking waiting for more
        int devrand_bytes = read_file(CYMRIC_RAND_FILE, scratch, 20);

        // Fill in the rest with /dev/urandom
        int min_bytes = 32 - devrand_bytes;
        if (read_file(CYMRIC_URAND_FILE, scratch + devrand_bytes, min_bytes) < min_bytes)
            return -6;

        if (blake2b_update(&state, scratch, 32))
            return -7;
        entropy += 256;
    }
#endif

#ifdef CYMRIC_WINCRYPT
    {
        // Mix in Windows cryptographic RNG
        HCRYPTPROV hCryptProv;
        if (!CryptAcquireContext(&hCryptProv, 0, 0, PROV_RSA_FULL, CRYPT_VERIFYCONTEXT|CRYPT_SILENT))
            return -8;
        if (hCryptProv && !CryptGenRandom(hCryptProv, 32, scratch))
            return -9;
        if (hCryptProv && !CryptReleaseContext(hCryptProv, 0))
            return -10;
        if (blake2b_update(&state, scratch, 32))
            return -11;
        entropy += 256;
    }
#endif

#ifdef CYMRIC_ARC4RANDOM
    {
        // Mix in arc4random
        arc4random_buf(scratch, 32);
        if (blake2b_update(&state, scratch, 32))
            return -12;
        entropy += 256;
    }
#endif
    
#ifdef CYMRIC_WINMEM
    {
        // Mix in Windows memory info
        MEMORYSTATUS *mem_stats = (MEMORYSTATUS *)scratch;
        GlobalMemoryStatus(mem_stats);
        if (blake2b_update(&state, scratch, sizeof(MEMORYSTATUS)))
            return -13;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_GETPID
    {
        // Mix in process id
        uint32_t *pid = (uint32_t *)scratch;
        *pid = (uint32_t)getpid();
        if (blake2b_update(&state, scratch, 4))
            return -14;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_GETTID
    {
        // Mix in thread id
        uint32_t *tid = (uint32_t *)scratch;
        *tid = unix_gettid();
        if (blake2b_update(&state, scratch, 4))
            return -15;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_PTHREADS
    {
        // Mix in pthread self id
        pthread_t *myself = (pthread_t *)scratch;
        *myself = pthread_self();
        if (blake2b_update(&state, scratch, sizeof(pthread_t)))
            return -16;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_WINTID
    {
        // Mix in thread id
        uint32_t *wintid = (uint32_t *)scratch;
        *wintid = GetCurrentThreadId();
        if (blake2b_update(&state, scratch, 4))
            return -17;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_USEC
    {
        // Mix in microsecond clock
        uint64_t *s0 = (uint64_t *)scratch;
        *s0 = GetMicrosecondTimeCounter();
        if (blake2b_update(&state, scratch, sizeof(double)))
            return -18;
        entropy += 32;
    }
#endif

#ifdef CYMRIC_SRANDOM
    {
        // Mix in srandom
        srandom(random() ^ time(0));
        uint32_t *sr = (uint32_t *)scratch;
        sr[0] = random();
        sr[1] = random();
        if (black2b_update(&state, scratch, 8))
            return -19;
        entropy += 40;
    }
#endif

#ifdef CYMRIC_SRAND
    {
        // Mix in srand
        srand(rand() ^ (unsigned int)time(0));
        uint32_t *sr = (uint32_t *)scratch;
        sr[0] = rand();
        sr[1] = rand();
        if (blake2b_update(&state, scratch, 8))
            return -20;
        entropy += 40;
    }
#endif

#ifdef CYMRIC_CYCLES
    {
        // Mix in final cycle count
        uint32_t *t1 = (uint32_t *)scratch;
        *t1 = GetCPUCycles();
        if (blake2b_update(&state, scratch, 4))
            return -21;
        entropy += 9;
    }
#endif

#ifdef CYMRIC_COUNTER
    {
        // Mix in incrementing counter
        uint32_t *c0 = (uint32_t *)scratch;
        *c0 = get_counter();
        if (blake2b_update(&state, scratch, 4))
            return -22;
        entropy += 1;
    }
#endif

    // Squeeze out 512 random bits from entropy sources
    if (blake2b_final(&state, (uint8_t *)R->internal, 64))
        return -23;

    // Erase BLAKE2 state and scratch
    CAT_SECURE_OBJCLR(state.buf);
    CAT_SECURE_OBJCLR(scratch);

    // Sanity check for compilation
    if (entropy < MIN_ENTROPY)
        return -24;

    // Indicate state is seeded
    R->internal[64] = 'S';
    R->internal[65] = 'E';
    R->internal[66] = 'E';
    R->internal[67] = 'D';

    return 0;
}